

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O2

uint16_t __thiscall r_exec::HLPContext::get_object_code_size(HLPContext *this)

{
  Data DVar1;
  Overlay *pOVar2;
  HLPOverlay *this_00;
  uint16_t uVar3;
  int iVar4;
  Code *pCVar5;
  
  DVar1 = (this->super__Context).data;
  if (DVar1 == BINDING_MAP) {
    this_00 = (HLPOverlay *)(this->super__Context).overlay;
    uVar3 = r_code::Atom::asIndex();
    uVar3 = HLPOverlay::get_value_code_size(this_00,uVar3);
    return uVar3;
  }
  if (DVar1 == VALUE_ARRAY) {
    pOVar2 = (this->super__Context).overlay;
    uVar3 = (uint16_t)
            ((uint)(*(int *)&(pOVar2->values).m_vector.
                             super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                   *(int *)&(pOVar2->values).m_vector.
                            super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
  }
  else {
    if (DVar1 == STEM) {
      pCVar5 = HLPOverlay::get_unpacked_object((HLPOverlay *)(this->super__Context).overlay);
      iVar4 = (*(pCVar5->super__Object)._vptr__Object[6])(pCVar5);
      return (uint16_t)iVar4;
    }
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

uint16_t HLPContext::get_object_code_size() const
{
    switch (data) {
    case STEM:
        return ((HLPOverlay *)overlay)->get_unpacked_object()->code_size();

    case BINDING_MAP:
        return ((HLPOverlay *)overlay)->get_value_code_size((*this)[0].asIndex());

    case VALUE_ARRAY:
        return overlay->values.size();

    default:
        return 0;
    }
}